

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O1

void G_DoCompleted(void)

{
  byte *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  FTextureID FVar6;
  int iVar7;
  level_info_t *plVar8;
  int *piVar9;
  cluster_info_t *cluster;
  cluster_info_t *pcVar10;
  wbplayerstruct_t *pwVar11;
  long lVar12;
  EFinishLevelType mode;
  uint uVar13;
  
  gameaction = ga_nothing;
  if (((uint)(gamestate + GS_FORCEWIPEBURN) < 2) || (gamestate == GS_STARTUP)) {
    return;
  }
  if (gamestate == GS_TITLELEVEL) {
    FString::operator=(&level.MapName,&nextlevel);
    G_DoLoadLevel(startpos,false);
    viewactive = true;
    startpos = 0;
    return;
  }
  if ((level.flags._3_1_ & 0x40) == 0) {
    plVar8 = FindLevelInfo(level.MapName.Chars,true);
    pbVar1 = (byte *)((long)&plVar8->flags + 3);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if (automapactive == true) {
    AM_Stop();
  }
  wminfo.finished_ep = level.cluster + -1;
  FVar6 = FTextureManager::CheckForTexture(&TexMan,((level.info)->PName).Chars,8,1);
  if ((uint)FVar6.texnum < TexMan.Textures.Count) {
    wminfo.LName0 = TexMan.Textures.Array[FVar6.texnum].Texture;
  }
  else {
    wminfo.LName0 = (FTexture *)0x0;
  }
  FString::operator=(&wminfo.current,&level.MapName);
  if (((deathmatch.Value == 0) || (((byte)dmflags.Value & 0x40) == 0)) ||
     ((level.flags._3_1_ & 0x40) != 0)) {
    plVar8 = FindLevelInfo(nextlevel.Chars,false);
    if ((plVar8 == (level_info_t *)0x0) || (iVar7 = strncmp(nextlevel.Chars,"enDSeQ",6), iVar7 == 0)
       ) {
      FString::operator=(&wminfo.next,&nextlevel);
    }
    else {
      FString::operator=(&wminfo.next,&plVar8->MapName);
      FVar6 = FTextureManager::CheckForTexture(&TexMan,(plVar8->PName).Chars,8,1);
      if ((uint)FVar6.texnum < TexMan.Textures.Count) {
        wminfo.LName1 = TexMan.Textures.Array[FVar6.texnum].Texture;
        goto LAB_004b1da8;
      }
    }
    wminfo.LName1 = (FTexture *)0x0;
  }
  else {
    FString::operator=(&wminfo.next,&level.MapName);
    wminfo.LName1 = wminfo.LName0;
  }
LAB_004b1da8:
  CheckWarpTransMap(&wminfo.next,true);
  FString::operator=(&nextlevel,&wminfo.next);
  plVar8 = FindLevelInfo(wminfo.next.Chars,true);
  wminfo.next_ep = plVar8->cluster + -1;
  wminfo.maxkills = level.total_monsters;
  wminfo.maxitems = level.total_items;
  wminfo.maxsecret = level.total_secrets;
  wminfo.partime = level.partime * 0x23;
  wminfo.maxfrags = 0;
  wminfo.sucktime = level.sucktime;
  wminfo.pnum = consoleplayer;
  wminfo.totaltime = level.totaltime;
  piVar9 = &DAT_00a39390;
  pwVar11 = wminfo.plyr;
  lVar12 = 0;
  iVar7 = level.time;
  do {
    pwVar11->in = playeringame[lVar12];
    pwVar11->skills = piVar9[-2];
    pwVar11->sitems = piVar9[-1];
    pwVar11->ssecret = *piVar9;
    pwVar11->stime = iVar7;
    uVar2 = *(undefined8 *)(piVar9 + -0x15);
    uVar3 = *(undefined8 *)(piVar9 + -0x13);
    uVar4 = *(undefined8 *)(piVar9 + -0x11);
    *(undefined8 *)pwVar11->frags = *(undefined8 *)(piVar9 + -0x17);
    *(undefined8 *)(pwVar11->frags + 2) = uVar2;
    *(undefined8 *)(pwVar11->frags + 4) = uVar3;
    *(undefined8 *)(pwVar11->frags + 6) = uVar4;
    pwVar11->fragcount = piVar9[-0xf];
    lVar12 = lVar12 + 1;
    piVar9 = piVar9 + 0xa8;
    pwVar11 = pwVar11 + 1;
  } while (lVar12 != 8);
  cluster = FindClusterInfo(level.cluster);
  pcVar10 = FindClusterInfo(wminfo.next_ep + 1);
  if (((cluster == pcVar10) && (deathmatch.Value == 0)) && ((cluster->flags & 1) != 0)) {
    uVar13 = 0;
    bVar5 = true;
    mode = FINISH_SameHub;
  }
  else {
    uVar13 = pcVar10->flags & 1;
    mode = FINISH_NoHub - uVar13;
    bVar5 = false;
  }
  G_LeavingHub(mode,cluster,&wminfo);
  lVar12 = 0;
  do {
    if (playeringame[lVar12] == true) {
      G_PlayerFinishLevel((int)lVar12,mode,changeflags);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 8);
  if (bVar5) {
    if ((int)level.flags2 < 0) {
      level_info_t::ClearSnapshot(level.info);
    }
    else {
      G_SnapshotLevel();
      FBehavior::StaticLockLevelVarStrings();
    }
  }
  else {
    G_ClearSnapshots();
    if ((char)uVar13 != '\0') {
      P_ClearACSVars(false);
    }
    level.time = 0;
    level.maptime = 0;
  }
  if ((deathmatch.Value == 0) &&
     ((((byte)level.flags & 1) != 0 || ((cluster == pcVar10 && ((cluster->flags & 1) != 0)))))) {
    G_WorldDone();
    return;
  }
  gamestate = GS_INTERMISSION;
  viewactive = false;
  automapactive = false;
  WI_Start(&wminfo);
  return;
}

Assistant:

void G_DoCompleted (void)
{
	int i; 

	gameaction = ga_nothing;

	if (   gamestate == GS_DEMOSCREEN
		|| gamestate == GS_FULLCONSOLE
		|| gamestate == GS_STARTUP)
	{
		return;
	}

	if (gamestate == GS_TITLELEVEL)
	{
		level.MapName = nextlevel;
		G_DoLoadLevel (startpos, false);
		startpos = 0;
		viewactive = true;
		return;
	}

	// [RH] Mark this level as having been visited
	if (!(level.flags & LEVEL_CHANGEMAPCHEAT))
		FindLevelInfo (level.MapName)->flags |= LEVEL_VISITED;

	if (automapactive)
		AM_Stop ();

	wminfo.finished_ep = level.cluster - 1;
	wminfo.LName0 = TexMan[TexMan.CheckForTexture(level.info->PName, FTexture::TEX_MiscPatch)];
	wminfo.current = level.MapName;

	if (deathmatch &&
		(dmflags & DF_SAME_LEVEL) &&
		!(level.flags & LEVEL_CHANGEMAPCHEAT))
	{
		wminfo.next = level.MapName;
		wminfo.LName1 = wminfo.LName0;
	}
	else
	{
		level_info_t *nextinfo = FindLevelInfo (nextlevel, false);
		if (nextinfo == NULL || strncmp (nextlevel, "enDSeQ", 6) == 0)
		{
			wminfo.next = nextlevel;
			wminfo.LName1 = NULL;
		}
		else
		{
			wminfo.next = nextinfo->MapName;
			wminfo.LName1 = TexMan[TexMan.CheckForTexture(nextinfo->PName, FTexture::TEX_MiscPatch)];
		}
	}

	CheckWarpTransMap (wminfo.next, true);
	nextlevel = wminfo.next;

	wminfo.next_ep = FindLevelInfo (wminfo.next)->cluster - 1;
	wminfo.maxkills = level.total_monsters;
	wminfo.maxitems = level.total_items;
	wminfo.maxsecret = level.total_secrets;
	wminfo.maxfrags = 0;
	wminfo.partime = TICRATE * level.partime;
	wminfo.sucktime = level.sucktime;
	wminfo.pnum = consoleplayer;
	wminfo.totaltime = level.totaltime;

	for (i=0 ; i<MAXPLAYERS ; i++)
	{
		wminfo.plyr[i].in = playeringame[i];
		wminfo.plyr[i].skills = players[i].killcount;
		wminfo.plyr[i].sitems = players[i].itemcount;
		wminfo.plyr[i].ssecret = players[i].secretcount;
		wminfo.plyr[i].stime = level.time;
		memcpy (wminfo.plyr[i].frags, players[i].frags
				, sizeof(wminfo.plyr[i].frags));
		wminfo.plyr[i].fragcount = players[i].fragcount;
	}

	// [RH] If we're in a hub and staying within that hub, take a snapshot
	//		of the level. If we're traveling to a new hub, take stuff from
	//		the player and clear the world vars. If this is just an
	//		ordinary cluster (not a hub), take stuff from the player, but
	//		leave the world vars alone.
	cluster_info_t *thiscluster = FindClusterInfo (level.cluster);
	cluster_info_t *nextcluster = FindClusterInfo (wminfo.next_ep+1);	// next_ep is cluster-1
	EFinishLevelType mode;

	if (thiscluster != nextcluster || deathmatch ||
		!(thiscluster->flags & CLUSTER_HUB))
	{
		if (nextcluster->flags & CLUSTER_HUB)
		{
			mode = FINISH_NextHub;
		}
		else
		{
			mode = FINISH_NoHub;
		}
	}
	else
	{
		mode = FINISH_SameHub;
	}

	// Intermission stats for entire hubs
	G_LeavingHub(mode, thiscluster, &wminfo);

	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
		{ // take away appropriate inventory
			G_PlayerFinishLevel (i, mode, changeflags);
		}
	}

	if (mode == FINISH_SameHub)
	{ // Remember the level's state for re-entry.
		if (!(level.flags2 & LEVEL2_FORGETSTATE))
		{
			G_SnapshotLevel ();
			// Do not free any global strings this level might reference
			// while it's not loaded.
			FBehavior::StaticLockLevelVarStrings();
		}
		else
		{ // Make sure we don't have a snapshot lying around from before.
			level.info->ClearSnapshot();
		}
	}
	else
	{ // Forget the states of all existing levels.
		G_ClearSnapshots ();

		if (mode == FINISH_NextHub)
		{ // Reset world variables for the new hub.
			P_ClearACSVars(false);
		}
		level.time = 0;
		level.maptime = 0;
	}

	if (!deathmatch &&
		((level.flags & LEVEL_NOINTERMISSION) ||
		((nextcluster == thiscluster) && (thiscluster->flags & CLUSTER_HUB))))
	{
		G_WorldDone ();
		return;
	}

	gamestate = GS_INTERMISSION;
	viewactive = false;
	automapactive = false;

// [RH] If you ever get a statistics driver operational, adapt this.
//	if (statcopy)
//		memcpy (statcopy, &wminfo, sizeof(wminfo));

	WI_Start (&wminfo);
}